

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.c
# Opt level: O0

int enet_socket_send(ENetSocket socket,ENetAddress *address,ENetBuffer *buffers,size_t bufferCount)

{
  ssize_t sVar1;
  int *piVar2;
  size_t in_RCX;
  iovec *in_RDX;
  undefined4 *in_RSI;
  int in_EDI;
  int sentLength;
  sockaddr_in sin;
  msghdr msgHdr;
  undefined2 local_68;
  uint16_t local_66;
  undefined4 local_64;
  msghdr local_58;
  size_t local_20;
  iovec *local_18;
  undefined4 *local_10;
  int local_8;
  int local_4;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_EDI;
  memset(&local_58,0,0x38);
  if (local_10 != (undefined4 *)0x0) {
    memset(&local_68,0,0x10);
    local_68 = 2;
    local_66 = htons(*(uint16_t *)(local_10 + 1));
    local_64 = *local_10;
    local_58.msg_name = &local_68;
    local_58.msg_namelen = 0x10;
  }
  local_58.msg_iov = local_18;
  local_58.msg_iovlen = local_20;
  sVar1 = sendmsg(local_8,&local_58,0x4000);
  local_4 = (int)sVar1;
  if (local_4 == -1) {
    piVar2 = __errno_location();
    if (*piVar2 == 0xb) {
      local_4 = 0;
    }
    else {
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

int
enet_socket_send (ENetSocket socket,
                  const ENetAddress * address,
                  const ENetBuffer * buffers,
                  size_t bufferCount)
{
    struct msghdr msgHdr;
    struct sockaddr_in sin;
    int sentLength;

    memset (& msgHdr, 0, sizeof (struct msghdr));

    if (address != NULL)
    {
        memset (& sin, 0, sizeof (struct sockaddr_in));

        sin.sin_family = AF_INET;
        sin.sin_port = ENET_HOST_TO_NET_16 (address -> port);
        sin.sin_addr.s_addr = address -> host;

        msgHdr.msg_name = & sin;
        msgHdr.msg_namelen = sizeof (struct sockaddr_in);
    }

    msgHdr.msg_iov = (struct iovec *) buffers;
    msgHdr.msg_iovlen = bufferCount;

    sentLength = sendmsg (socket, & msgHdr, MSG_NOSIGNAL);
    
    if (sentLength == -1)
    {
       if (errno == EWOULDBLOCK)
         return 0;

       return -1;
    }

    return sentLength;
}